

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCore.c
# Opt level: O2

Gia_Man_t * Cec_ManSatSweeping(Gia_Man_t *pAig,Cec_ParFra_t *pPars,int fSilent)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  bool bVar7;
  int iVar8;
  uint level;
  uint uVar9;
  abctime aVar10;
  Gia_Man_t *pGVar11;
  Cec_ManFra_t *p;
  Gia_Man_t *p_00;
  Cec_ManPat_t *pPat;
  abctime aVar12;
  abctime aVar13;
  undefined4 extraout_var;
  abctime aVar14;
  Gia_Man_t *pGVar15;
  int *piVar16;
  Cec_ParFra_t *pCVar17;
  ulong Time;
  abctime time;
  abctime time_00;
  Gia_Man_t *pGVar18;
  char *pcVar19;
  uint uVar20;
  long lVar21;
  double dVar22;
  double dVar23;
  int local_a0;
  undefined8 local_98;
  Cec_ParSat_t local_80;
  Cec_ParSim_t local_60;
  
  aVar10 = Abc_Clock();
  Gia_ManRandom(1);
  pGVar11 = Gia_ManDup(pAig);
  piVar6 = pAig->pNexts;
  pGVar11->pReprs = pAig->pReprs;
  pGVar11->pNexts = piVar6;
  pAig->pReprs = (Gia_Rpr_t *)0x0;
  pAig->pNexts = (int *)0x0;
  p = Cec_ManFraStart(pGVar11,pPars);
  if (pPars->fDualOut != 0) {
    pPars->fColorDiff = 1;
  }
  local_60.fLatchCorr = 0;
  local_60.fConstCorr = 0;
  local_60.nRounds = 0x14;
  local_60.nNonRefines = 3;
  local_60.fVeryVerbose = 0;
  local_60.nWords = pPars->nWords;
  local_60.nFrames = pPars->nRounds;
  local_60.fSeqSimulate = 0;
  local_60.fCheckMiter = pPars->fCheckMiter;
  local_60._16_8_ = (ulong)(uint)pPars->fDualOut << 0x20;
  local_60.fVerbose = pPars->fVerbose;
  pGVar11 = p->pAig;
  p_00 = (Gia_Man_t *)Cec_ManSimStart(pGVar11,&local_60);
  local_80.nSatVarMax = 2000;
  local_80.nCallsRecycle = 200;
  local_80.fNonChrono = 0;
  local_80.fPolarFlip = 1;
  local_80.fCheckMiter = 0;
  local_80.fLearnCls = 0;
  local_80.nBTLimit = pPars->nBTLimit;
  local_80.fVerbose = pPars->fVeryVerbose;
  pPat = Cec_ManPatStart();
  pPat->fVerbose = pPars->fVeryVerbose;
  aVar12 = Abc_Clock();
  if ((p->pAig->pReprs == (Gia_Rpr_t *)0x0) &&
     ((iVar8 = Cec_ManSimClassesPrepare((Cec_ManSim_t *)p_00,-1), iVar8 != 0 ||
      (pGVar11 = p_00, iVar8 = Cec_ManSimClassesRefine((Cec_ManSim_t *)p_00), iVar8 != 0)))) {
    pGVar18 = p->pAig;
LAB_004d1ec7:
    Gia_ManStop(pGVar18);
    local_a0 = (int)pGVar18;
    p->pAig = (Gia_Man_t *)0x0;
    bVar7 = true;
    pGVar18 = (Gia_Man_t *)0x0;
  }
  else {
    piVar6 = &pPars->fDualOut;
    aVar13 = Abc_Clock();
    p->timeSim = p->timeSim + (aVar13 - aVar12);
    piVar1 = &pPars->fColorDiff;
    for (uVar20 = 1; local_a0 = (int)pGVar11, (int)uVar20 <= pPars->nItersMax; uVar20 = uVar20 + 1)
    {
      aVar12 = Abc_Clock();
      if (*piVar6 == 0) {
        local_98 = 0;
      }
      else {
        iVar8 = Gia_ManEquivSetColors(p->pAig,pPars->fVeryVerbose);
        local_98 = CONCAT44(extraout_var,iVar8);
      }
      bVar7 = true;
      pGVar11 = Cec_ManFraSpecReduction(p);
      if (pPars->fVeryVerbose != 0) {
        Gia_ManPrintStats(pGVar11,(Gps_Par_t *)0x0);
      }
      piVar16 = piVar6;
      if (pGVar11->vCos->nSize == 0) {
        Gia_ManStop(pGVar11);
        local_a0 = (int)pGVar11;
        if (p->pPars->fVerbose != 0) {
          Abc_Print(local_a0,"Considered all available candidate equivalences.\n");
        }
        if (*piVar6 == 0) goto LAB_004d1f16;
        pGVar18 = p->pAig;
        pGVar11 = pGVar18;
        iVar8 = Gia_ManAndNum(pGVar18);
        local_a0 = (int)pGVar11;
        if (iVar8 < 1) goto LAB_004d1edc;
        iVar8 = p->pPars->fVerbose;
        if (*piVar1 == 0) {
          if (iVar8 != 0) {
            Abc_Print(local_a0,"Switching into normal mode.\n");
          }
        }
        else {
joined_r0x004d1c76:
          piVar16 = piVar1;
          if (iVar8 != 0) {
            Abc_Print((int)pGVar11,"Switching into reduced mode.\n");
          }
        }
LAB_004d1e8e:
        *piVar16 = 0;
      }
      else {
        aVar13 = Abc_Clock();
        if (pPars->fRunCSat == 0) {
          Cec_ManSatSolve(pPat,pGVar11,&local_80);
        }
        else {
          Cec_ManSatSolveCSat(pPat,pGVar11,&local_80);
        }
        aVar14 = Abc_Clock();
        p->timeSat = p->timeSat + (aVar14 - aVar13);
        iVar8 = Cec_ManFraClassesUpdate(p,(Cec_ManSim_t *)p_00,pPat,pGVar11);
        Gia_ManStop(pGVar11);
        pGVar18 = p->pAig;
        if (iVar8 != 0) goto LAB_004d1ec7;
        pGVar11 = pGVar18;
        pGVar15 = Gia_ManEquivReduceAndRemap(pGVar18,0,local_60.fDualOut);
        local_a0 = (int)pGVar11;
        p->pAig = pGVar15;
        p_00->pName = (char *)pGVar15;
        if (pGVar15 == (Gia_Man_t *)0x0) {
          p->pAig = pGVar18;
LAB_004d1edc:
          bVar7 = true;
          goto LAB_004d1f19;
        }
        Gia_ManStop(pGVar18);
        if (p->pPars->fVerbose != 0) {
          uVar9 = p->nAllProved;
          uVar2 = p->nAllDisproved;
          uVar3 = p->nAllFailed;
          level = Gia_ManAndNum(p->pAig);
          pcVar19 = "%3d : P =%7d. D =%7d. F =%6d. M = %7d. And =%8d. ";
          Abc_Print(level,"%3d : P =%7d. D =%7d. F =%6d. M = %7d. And =%8d. ",(ulong)uVar20,
                    (ulong)uVar9,(ulong)uVar2,(ulong)uVar3,local_98,(ulong)level);
          aVar13 = Abc_Clock();
          Abc_PrintTime((int)aVar13 - (int)aVar12,pcVar19,time);
        }
        pGVar11 = p->pAig;
        iVar8 = Gia_ManAndNum(pGVar11);
        local_a0 = (int)pGVar11;
        pCVar17 = p->pPars;
        if (iVar8 == 0) {
          if (pCVar17->fVerbose != 0) {
            Abc_Print(local_a0,"Network after reduction is empty.\n");
          }
          goto LAB_004d1f16;
        }
        if (pCVar17->TimeLimit != 0) {
          aVar12 = Abc_Clock();
          local_a0 = (int)pGVar11;
          pCVar17 = p->pPars;
          if ((long)pCVar17->TimeLimit <= (aVar12 - aVar10) / 1000000) {
            bVar7 = false;
            goto LAB_004d1f16;
          }
        }
        local_a0 = (int)pGVar11;
        if (p->nAllDisproved + p->nAllProved < p->nAllFailed) {
          if (10000 < local_80.nBTLimit) goto LAB_004d1f16;
          if (pPars->fSatSweeping != 0) {
            if (pCVar17->fVerbose != 0) {
              Abc_Print(local_a0,"Exceeded the limit on the number of conflicts (%d).\n");
            }
            goto LAB_004d1f16;
          }
          local_80.nBTLimit = local_80.nBTLimit * 10;
          if (pCVar17->fVerbose != 0) {
            Abc_Print(local_a0,"Increasing conflict limit to %d.\n");
          }
        }
        if (*piVar6 != 0) {
          pGVar11 = p->pAig;
          if ((*piVar1 != 0) &&
             ((pGVar18 = pGVar11, iVar8 = Gia_ManAndNum(pGVar11), iVar8 < 100000 ||
              (p->nAllDisproved + p->nAllProved < 10)))) {
            iVar8 = p->pPars->fVerbose;
            pGVar11 = pGVar18;
            goto joined_r0x004d1c76;
          }
          iVar8 = Gia_ManAndNum(pGVar11);
          if ((iVar8 < 20000) || (p->nAllDisproved + p->nAllProved < 10)) {
            if (p->pPars->fVerbose != 0) {
              Abc_Print((int)pGVar11,"Switching into normal mode.\n");
            }
            *piVar1 = 0;
            goto LAB_004d1e8e;
          }
        }
      }
    }
    bVar7 = true;
LAB_004d1f16:
    pGVar18 = p->pAig;
  }
LAB_004d1f19:
  if (p->pPars->fVerbose == 0) {
LAB_004d202a:
    p->pAig = (Gia_Man_t *)0x0;
    if (pGVar18 == (Gia_Man_t *)0x0) goto LAB_004d2041;
  }
  else {
    if (pGVar18 != (Gia_Man_t *)0x0) {
      uVar20 = Gia_ManAndNum(pAig);
      pGVar11 = pGVar18;
      uVar9 = Gia_ManAndNum(pGVar18);
      dVar23 = 1.0;
      dVar22 = 1.0;
      if (uVar20 != 0) {
        dVar22 = (double)(int)uVar20;
      }
      iVar8 = pAig->nRegs;
      if (iVar8 != 0) {
        dVar23 = (double)iVar8;
      }
      Time = (ulong)uVar9;
      Abc_Print((int)pGVar11,
                "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n"
                ,SUB84(((double)(int)(uVar20 - uVar9) * 100.0) / dVar22,0),
                ((double)(iVar8 - pGVar18->nRegs) * 100.0) / dVar23,(ulong)uVar20);
      pcVar19 = (char *)p->timeSim;
      aVar12 = Abc_Clock();
      local_a0 = (int)aVar10;
      lVar21 = (long)local_a0;
      Abc_PrintTimeP(0x7d3589,pcVar19,aVar12 - lVar21,Time);
      lVar4 = p->timeSat;
      lVar5 = pPat->timeTotalSave;
      aVar12 = Abc_Clock();
      Abc_PrintTimeP(0x7d358e,(char *)(lVar4 - lVar5),aVar12 - lVar21,Time);
      pcVar19 = (char *)(pPat->timeTotalSave + p->timePat);
      aVar12 = Abc_Clock();
      Abc_PrintTimeP(0x7d3593,pcVar19,aVar12 - lVar21,Time);
      aVar12 = Abc_Clock();
      local_a0 = (int)aVar12 - local_a0;
      Abc_PrintTime(local_a0,pcVar19,time_00);
      pGVar18 = p->pAig;
      goto LAB_004d202a;
    }
    p->pAig = (Gia_Man_t *)0x0;
LAB_004d2041:
    iVar8 = p_00->nHTable;
    if (-1 < iVar8) {
      if (fSilent == 0) {
        Abc_Print(local_a0,"Disproved at least one output of the miter (zero-based number %d).\n");
        iVar8 = p_00->nHTable;
      }
      pPars->iOutFail = iVar8;
      pGVar18 = (Gia_Man_t *)0x0;
      goto LAB_004d208c;
    }
    pGVar18 = (Gia_Man_t *)0x0;
  }
  if ((fSilent == 0) && (p_00->pHTable != (int *)0x0)) {
    Abc_Print(local_a0,"Disproved %d outputs of the miter.\n",(ulong)(uint)p_00->fAddStrash);
  }
LAB_004d208c:
  if (fSilent == 0 && !bVar7) {
    aVar12 = Abc_Clock();
    Abc_Print(local_a0,"Timed out after %d seconds.\n",
              (long)((int)((double)aVar12 - (double)aVar10) / 1000000));
  }
  pAig->pCexComb = *(Abc_Cex_t **)&p_00->fSweeper;
  p_00->fSweeper = 0;
  p_00->fGiaSimple = 0;
  Cec_ManSimStop((Cec_ManSim_t *)p_00);
  Cec_ManPatStop(pPat);
  Cec_ManFraStop(p);
  return pGVar18;
}

Assistant:

Gia_Man_t * Cec_ManSatSweeping( Gia_Man_t * pAig, Cec_ParFra_t * pPars, int fSilent )
{
    int fOutputResult = 0;
    Cec_ParSat_t ParsSat, * pParsSat = &ParsSat;
    Cec_ParSim_t ParsSim, * pParsSim = &ParsSim;
    Gia_Man_t * pIni, * pSrm, * pTemp;
    Cec_ManFra_t * p;
    Cec_ManSim_t * pSim;
    Cec_ManPat_t * pPat;
    int i, fTimeOut = 0, nMatches = 0;
    abctime clk, clk2, clkTotal = Abc_Clock();

    // duplicate AIG and transfer equivalence classes
    Gia_ManRandom( 1 );
    pIni = Gia_ManDup(pAig);
    pIni->pReprs = pAig->pReprs; pAig->pReprs = NULL;
    pIni->pNexts = pAig->pNexts; pAig->pNexts = NULL;

    // prepare the managers
    // SAT sweeping
    p = Cec_ManFraStart( pIni, pPars );
    if ( pPars->fDualOut )
        pPars->fColorDiff = 1;
    // simulation
    Cec_ManSimSetDefaultParams( pParsSim );
    pParsSim->nWords      = pPars->nWords;
    pParsSim->nFrames     = pPars->nRounds;
    pParsSim->fCheckMiter = pPars->fCheckMiter;
    pParsSim->fDualOut    = pPars->fDualOut;
    pParsSim->fVerbose    = pPars->fVerbose;
    pSim = Cec_ManSimStart( p->pAig, pParsSim );
    // SAT solving
    Cec_ManSatSetDefaultParams( pParsSat );
    pParsSat->nBTLimit = pPars->nBTLimit;
    pParsSat->fVerbose = pPars->fVeryVerbose;
    // simulation patterns
    pPat = Cec_ManPatStart();
    pPat->fVerbose = pPars->fVeryVerbose;

    // start equivalence classes
clk = Abc_Clock();
    if ( p->pAig->pReprs == NULL )
    {
        if ( Cec_ManSimClassesPrepare(pSim, -1) || Cec_ManSimClassesRefine(pSim) )
        {
            Gia_ManStop( p->pAig );
            p->pAig = NULL;
            goto finalize;
        }
    }
p->timeSim += Abc_Clock() - clk;
    // perform solving
    for ( i = 1; i <= pPars->nItersMax; i++ )
    {
        clk2 = Abc_Clock();
        nMatches = 0;
        if ( pPars->fDualOut )
        {
            nMatches = Gia_ManEquivSetColors( p->pAig, pPars->fVeryVerbose );
//            p->pAig->pIso = Cec_ManDetectIsomorphism( p->pAig );
//            Gia_ManEquivTransform( p->pAig, 1 );
        }
        pSrm = Cec_ManFraSpecReduction( p ); 

//        Gia_AigerWrite( pSrm, "gia_srm.aig", 0, 0 );

        if ( pPars->fVeryVerbose )
            Gia_ManPrintStats( pSrm, NULL );
        if ( Gia_ManCoNum(pSrm) == 0 )
        {
            Gia_ManStop( pSrm );
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Considered all available candidate equivalences.\n" );
            if ( pPars->fDualOut && Gia_ManAndNum(p->pAig) > 0 )
            {
                if ( pPars->fColorDiff )
                {
                    if ( p->pPars->fVerbose )
                        Abc_Print( 1, "Switching into reduced mode.\n" );
                    pPars->fColorDiff = 0;
                }
                else
                {
                    if ( p->pPars->fVerbose )
                        Abc_Print( 1, "Switching into normal mode.\n" );
                    pPars->fDualOut = 0;
                }
                continue;
            }
            break;
        }
clk = Abc_Clock();
        if ( pPars->fRunCSat )
            Cec_ManSatSolveCSat( pPat, pSrm, pParsSat ); 
        else
            Cec_ManSatSolve( pPat, pSrm, pParsSat ); 
p->timeSat += Abc_Clock() - clk;
        if ( Cec_ManFraClassesUpdate( p, pSim, pPat, pSrm ) )
        {
            Gia_ManStop( pSrm );
            Gia_ManStop( p->pAig );
            p->pAig = NULL;
            goto finalize;
        }
        Gia_ManStop( pSrm );

        // update the manager
        pSim->pAig = p->pAig = Gia_ManEquivReduceAndRemap( pTemp = p->pAig, 0, pParsSim->fDualOut );
        if ( p->pAig == NULL )
        {
            p->pAig = pTemp;
            break;
        }
        Gia_ManStop( pTemp );
        if ( p->pPars->fVerbose )
        {
            Abc_Print( 1, "%3d : P =%7d. D =%7d. F =%6d. M = %7d. And =%8d. ", 
                i, p->nAllProved, p->nAllDisproved, p->nAllFailed, nMatches, Gia_ManAndNum(p->pAig) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );
        }
        if ( Gia_ManAndNum(p->pAig) == 0 )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Network after reduction is empty.\n" );
            break;
        }
        // check resource limits
        if ( p->pPars->TimeLimit && (Abc_Clock() - clkTotal)/CLOCKS_PER_SEC >= p->pPars->TimeLimit )
        {
            fTimeOut = 1;
            break;
        }
//        if ( p->nAllFailed && !p->nAllProved && !p->nAllDisproved )
        if ( p->nAllFailed > p->nAllProved + p->nAllDisproved )
        {
            if ( pParsSat->nBTLimit >= 10001 )
                break;
            if ( pPars->fSatSweeping )
            {
                if ( p->pPars->fVerbose )
                    Abc_Print( 1, "Exceeded the limit on the number of conflicts (%d).\n", pParsSat->nBTLimit );
                break;
            }
            pParsSat->nBTLimit *= 10;
            if ( p->pPars->fVerbose )
            {
                if ( p->pPars->fVerbose )
                    Abc_Print( 1, "Increasing conflict limit to %d.\n", pParsSat->nBTLimit );
                if ( fOutputResult )
                {
                    Gia_AigerWrite( p->pAig, "gia_cec_temp.aig", 0, 0 );
                    Abc_Print( 1,"The result is written into file \"%s\".\n", "gia_cec_temp.aig" );
                }
            }
        }
        if ( pPars->fDualOut && pPars->fColorDiff && (Gia_ManAndNum(p->pAig) < 100000 || p->nAllProved + p->nAllDisproved < 10) )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Switching into reduced mode.\n" );
            pPars->fColorDiff = 0;
        }
//        if ( pPars->fDualOut && Gia_ManAndNum(p->pAig) < 20000 )
        else if ( pPars->fDualOut && (Gia_ManAndNum(p->pAig) < 20000 || p->nAllProved + p->nAllDisproved < 10) )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Switching into normal mode.\n" );
            pPars->fColorDiff = 0;
            pPars->fDualOut = 0;
        }
    }
finalize:
    if ( p->pPars->fVerbose && p->pAig )
    {
        Abc_Print( 1, "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n", 
            Gia_ManAndNum(pAig), Gia_ManAndNum(p->pAig), 
            100.0*(Gia_ManAndNum(pAig)-Gia_ManAndNum(p->pAig))/(Gia_ManAndNum(pAig)?Gia_ManAndNum(pAig):1), 
            Gia_ManRegNum(pAig), Gia_ManRegNum(p->pAig), 
            100.0*(Gia_ManRegNum(pAig)-Gia_ManRegNum(p->pAig))/(Gia_ManRegNum(pAig)?Gia_ManRegNum(pAig):1) );
        Abc_PrintTimeP( 1, "Sim ", p->timeSim, Abc_Clock() - (int)clkTotal );
        Abc_PrintTimeP( 1, "Sat ", p->timeSat-pPat->timeTotalSave, Abc_Clock() - (int)clkTotal );
        Abc_PrintTimeP( 1, "Pat ", p->timePat+pPat->timeTotalSave, Abc_Clock() - (int)clkTotal );
        Abc_PrintTime( 1, "Time", (int)(Abc_Clock() - clkTotal) );
    }

    pTemp = p->pAig; p->pAig = NULL;
    if ( pTemp == NULL && pSim->iOut >= 0 )
    {
        if ( !fSilent )
        Abc_Print( 1, "Disproved at least one output of the miter (zero-based number %d).\n", pSim->iOut );
        pPars->iOutFail = pSim->iOut;
    }
    else if ( pSim->pCexes && !fSilent )
        Abc_Print( 1, "Disproved %d outputs of the miter.\n", pSim->nOuts );
    if ( fTimeOut && !fSilent )
        Abc_Print( 1, "Timed out after %d seconds.\n", (int)((double)Abc_Clock() - clkTotal)/CLOCKS_PER_SEC );

    pAig->pCexComb = pSim->pCexComb; pSim->pCexComb = NULL;
    Cec_ManSimStop( pSim );
    Cec_ManPatStop( pPat );
    Cec_ManFraStop( p );
    return pTemp;
}